

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O2

void __thiscall iqxmlrpc::ValueBuilder::do_visit_element(ValueBuilder *this,string *tagname)

{
  Parser *pPVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  auto_ptr<iqxmlrpc::Value_type> aVar4;
  StructBuilder local_80;
  
  iVar2 = StateMachine::change(&this->state_,tagname);
  if (iVar2 == 10) {
    aVar4._M_ptr = (Value_type *)operator_new(0x10);
    *aVar4._M_ptr = (_func_int **)0x0;
    ((size_type *)aVar4._M_ptr)[1] = 0;
    *aVar4._M_ptr = (Value_type)&PTR__Value_type_0019f048;
  }
  else if (iVar2 == 9) {
    pPVar1 = (this->super_ValueBuilderBase).super_BuilderBase.parser_;
    ValueBuilderBase::ValueBuilderBase(&local_80.super_ValueBuilderBase,pPVar1,false);
    local_80.super_ValueBuilderBase.super_BuilderBase._vptr_BuilderBase =
         (_func_int **)&PTR_do_visit_element_0019ed88;
    StateMachine::StateMachine(&local_80.state_,pPVar1,0);
    local_80.name_._M_dataplus._M_p = (pointer)0x0;
    StateMachine::set_transitions
              (&local_80.state_,
               (StateTransition *)
               (anonymous_namespace)::ArrayBuilder::ArrayBuilder(iqxmlrpc::Parser&)::trans);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0x20);
    paVar3->_M_allocated_capacity = (size_type)&PTR__Array_0019ef38;
    (&paVar3->_M_allocated_capacity)[3] = 0;
    (&paVar3->_M_allocated_capacity)[1] = 0;
    (&paVar3->_M_allocated_capacity)[2] = 0;
    aVar4._M_ptr = local_80.super_ValueBuilderBase.retval._M_ptr;
    local_80.name_._M_dataplus._M_p = (pointer)paVar3;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_80.super_ValueBuilderBase.retval._M_ptr != paVar3) &&
       (aVar4._M_ptr = (Value_type *)paVar3,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_80.super_ValueBuilderBase.retval._M_ptr !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_80.super_ValueBuilderBase.retval._M_ptr)->_vptr_Value_type)->
                   _M_allocated_capacity + 8))();
    }
    local_80.super_ValueBuilderBase.retval._M_ptr = aVar4._M_ptr;
    BuilderBase::build((BuilderBase *)&local_80,true);
    aVar4._M_ptr = local_80.super_ValueBuilderBase.retval._M_ptr;
  }
  else {
    if (iVar2 != 8) goto LAB_00179ec5;
    pPVar1 = (this->super_ValueBuilderBase).super_BuilderBase.parser_;
    ValueBuilderBase::ValueBuilderBase(&local_80.super_ValueBuilderBase,pPVar1,false);
    local_80.super_ValueBuilderBase.super_BuilderBase._vptr_BuilderBase =
         (_func_int **)&PTR_do_visit_element_0019ed08;
    StateMachine::StateMachine(&local_80.state_,pPVar1,0);
    local_80.name_._M_dataplus._M_p = (pointer)&local_80.name_.field_2;
    local_80.name_._M_string_length = 0;
    local_80.name_.field_2._M_local_buf[0] = '\0';
    local_80.value_ = (Value_type *)0x0;
    StateMachine::set_transitions
              (&local_80.state_,
               (StateTransition *)
               (anonymous_namespace)::StructBuilder::StructBuilder(iqxmlrpc::Parser&)::trans);
    local_80.proxy_ = (Struct *)operator_new(0x38);
    *(undefined ***)local_80.proxy_ = &PTR__Struct_0019ef70;
    *(char *)((long)local_80.proxy_ + 0x10) = '\0';
    *(char *)((long)local_80.proxy_ + 0x11) = '\0';
    *(char *)((long)local_80.proxy_ + 0x12) = '\0';
    *(char *)((long)local_80.proxy_ + 0x13) = '\0';
    *(char *)((long)local_80.proxy_ + 0x18) = '\0';
    *(char *)((long)local_80.proxy_ + 0x19) = '\0';
    *(char *)((long)local_80.proxy_ + 0x1a) = '\0';
    *(char *)((long)local_80.proxy_ + 0x1b) = '\0';
    *(char *)((long)local_80.proxy_ + 0x1c) = '\0';
    *(char *)((long)local_80.proxy_ + 0x1d) = '\0';
    *(char *)((long)local_80.proxy_ + 0x1e) = '\0';
    *(char *)((long)local_80.proxy_ + 0x1f) = '\0';
    *(char **)((long)local_80.proxy_ + 0x20) = (char *)((long)local_80.proxy_ + 0x10);
    *(char **)((long)local_80.proxy_ + 0x28) = (char *)((long)local_80.proxy_ + 0x10);
    *(char *)((long)local_80.proxy_ + 0x30) = '\0';
    *(char *)((long)local_80.proxy_ + 0x31) = '\0';
    *(char *)((long)local_80.proxy_ + 0x32) = '\0';
    *(char *)((long)local_80.proxy_ + 0x33) = '\0';
    *(char *)((long)local_80.proxy_ + 0x34) = '\0';
    *(char *)((long)local_80.proxy_ + 0x35) = '\0';
    *(char *)((long)local_80.proxy_ + 0x36) = '\0';
    *(char *)((long)local_80.proxy_ + 0x37) = '\0';
    aVar4._M_ptr = local_80.super_ValueBuilderBase.retval._M_ptr;
    if (((Struct *)local_80.super_ValueBuilderBase.retval._M_ptr != local_80.proxy_) &&
       (aVar4._M_ptr = (Value_type *)local_80.proxy_,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_80.super_ValueBuilderBase.retval._M_ptr !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_80.super_ValueBuilderBase.retval._M_ptr)->_vptr_Value_type)->
                   _M_allocated_capacity + 8))();
    }
    local_80.super_ValueBuilderBase.retval._M_ptr = aVar4._M_ptr;
    BuilderBase::build((BuilderBase *)&local_80,true);
    aVar4._M_ptr = local_80.super_ValueBuilderBase.retval._M_ptr;
    local_80.super_ValueBuilderBase.retval._M_ptr = (Value_type *)0x0;
    anon_unknown_7::StructBuilder::~StructBuilder(&local_80);
  }
  std::auto_ptr<iqxmlrpc::Value_type>::reset(&(this->super_ValueBuilderBase).retval,aVar4._M_ptr);
LAB_00179ec5:
  if ((this->super_ValueBuilderBase).retval._M_ptr != (Value_type *)0x0) {
    (this->super_ValueBuilderBase).super_BuilderBase.want_exit_ = true;
  }
  return;
}

Assistant:

void
ValueBuilder::do_visit_element(const std::string& tagname)
{
  switch (state_.change(tagname)) {
  case STRUCT:
    retval.reset(sub_build<Value_type*, StructBuilder>(true));
    break;

  case ARRAY:
    retval.reset(sub_build<Value_type*, ArrayBuilder>(true));
    break;

  case NIL:
    retval.reset(new Nil());
    break;

  default:
    // wait for text within <i4>...</i4>, etc...
    break;
  }

  if (retval.get())
    want_exit();
}